

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::api::anon_unknown_1::RenderPass::create
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *param_3)

{
  undefined8 uVar1;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar2;
  long lVar3;
  undefined8 *puVar4;
  VkAttachmentDescription *pVVar5;
  VkAttachmentReference dsAttachment;
  VkAttachmentReference colorAttachments [1];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpasses [1];
  VkAttachmentDescription attachments [2];
  VkAttachmentReference local_e8;
  VkAttachmentReference local_e0;
  VkRenderPassCreateInfo local_d8;
  VkSubpassDescription local_98;
  VkAttachmentDescription local_48 [2];
  
  local_98.pDepthStencilAttachment = &local_e8;
  local_d8.pAttachments = local_48;
  puVar4 = &DAT_00aceee0;
  pVVar5 = local_d8.pAttachments;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *puVar4;
    pVVar5->flags = (int)uVar1;
    pVVar5->format = (int)((ulong)uVar1 >> 0x20);
    puVar4 = puVar4 + 1;
    pVVar5 = (VkAttachmentDescription *)&pVVar5->samples;
  }
  local_98.pColorAttachments = &local_e0;
  local_e0.attachment = 0;
  local_e0.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_e8.attachment = 1;
  local_e8.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  local_d8.pSubpasses = &local_98;
  local_98.flags = 0;
  local_98.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_98.inputAttachmentCount = 0;
  local_98.pInputAttachments = (VkAttachmentReference *)0x0;
  local_98.colorAttachmentCount = 1;
  local_98.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_98.preserveAttachmentCount = 0;
  local_98.pPreserveAttachments = (deUint32 *)0x0;
  local_d8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_d8.pNext = (void *)0x0;
  local_d8.flags = 0;
  local_d8.attachmentCount = 2;
  local_d8.subpassCount = 1;
  local_d8.dependencyCount = 0;
  local_d8.pDependencies = (VkSubpassDependency *)0x0;
  pMVar2 = ::vk::createRenderPass
                     (__return_storage_ptr__,env->vkd,env->device,&local_d8,env->allocationCallbacks
                     );
  return pMVar2;
}

Assistant:

static Move<VkRenderPass> create (const Environment& env, const Resources&, const Parameters&)
	{
		const VkAttachmentDescription	attachments[]		=
		{
			{
				(VkAttachmentDescriptionFlags)0,
				VK_FORMAT_R8G8B8A8_UNORM,
				VK_SAMPLE_COUNT_1_BIT,
				VK_ATTACHMENT_LOAD_OP_CLEAR,
				VK_ATTACHMENT_STORE_OP_STORE,
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			},
			{
				(VkAttachmentDescriptionFlags)0,
				VK_FORMAT_D16_UNORM,
				VK_SAMPLE_COUNT_1_BIT,
				VK_ATTACHMENT_LOAD_OP_CLEAR,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
			}
		};
		const VkAttachmentReference		colorAttachments[]	=
		{
			{
				0u,											// attachment
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			}
		};
		const VkAttachmentReference		dsAttachment		=
		{
			1u,											// attachment
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL
		};
		const VkSubpassDescription		subpasses[]			=
		{
			{
				(VkSubpassDescriptionFlags)0,
				VK_PIPELINE_BIND_POINT_GRAPHICS,
				0u,											// inputAttachmentCount
				DE_NULL,									// pInputAttachments
				DE_LENGTH_OF_ARRAY(colorAttachments),
				colorAttachments,
				DE_NULL,									// pResolveAttachments
				&dsAttachment,
				0u,											// preserveAttachmentCount
				DE_NULL,									// pPreserveAttachments
			}
		};
		const VkRenderPassCreateInfo	renderPassInfo		=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
			DE_NULL,
			(VkRenderPassCreateFlags)0,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			DE_LENGTH_OF_ARRAY(subpasses),
			subpasses,
			0u,												// dependencyCount
			DE_NULL											// pDependencies
		};

		return createRenderPass(env.vkd, env.device, &renderPassInfo, env.allocationCallbacks);
	}